

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O3

void pigpio_stop(void)

{
  gPigStarted = 0;
  if (pthNotify != (pthread_t *)0x0) {
    stop_thread(pthNotify);
    pthNotify = (pthread_t *)0x0;
  }
  if (-1 < gPigNotify) {
    if (-1 < gPigHandle) {
      pigpio_command(gPigNotify,0x15,gPigHandle,0,1);
      gPigHandle = -1;
    }
    close(gPigNotify);
    gPigNotify = -1;
  }
  if (-1 < gPigCommand) {
    if (-1 < gPigHandle) {
      pigpio_command(gPigCommand,0x15,gPigHandle,0,1);
      gPigHandle = -1;
    }
    close(gPigCommand);
    gPigCommand = -1;
  }
  return;
}

Assistant:

void pigpio_stop(void)
{
   gPigStarted = 0;

   if (pthNotify)
   {
      stop_thread(pthNotify);
      pthNotify = 0;
   }

   if (gPigNotify >= 0)
   {
      if (gPigHandle >= 0)
      {
         pigpio_command(gPigNotify, PI_CMD_NC, gPigHandle, 0, 1);
         gPigHandle = -1;
      }

      close(gPigNotify);
      gPigNotify = -1;
   }

   if (gPigCommand >= 0)
   {
      if (gPigHandle >= 0)
      {
         pigpio_command(gPigCommand, PI_CMD_NC, gPigHandle, 0, 1);
         gPigHandle = -1;
      }

      close(gPigCommand);
      gPigCommand = -1;
   }
}